

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O1

RK_S64 mpp_stopwatch_elapsed_time(MppStopwatch stopwatch)

{
  MPP_RET MVar1;
  
  if ((stopwatch != (MppStopwatch)0x0) &&
     (MVar1 = check_is_mpp_stopwatch(stopwatch), MVar1 == MPP_OK)) {
    if ((long)*(int *)((long)stopwatch + 0x4c) < 2) {
      return 0;
    }
    return *(long *)(*(long *)((long)stopwatch + 0x60) + -8 +
                    (long)*(int *)((long)stopwatch + 0x4c) * 0x48) -
           *(long *)(*(long *)((long)stopwatch + 0x60) + 0x40);
  }
  _mpp_log_l(2,"mpp_time","invalid stopwatch %p\n","mpp_stopwatch_elapsed_time",stopwatch);
  return 0;
}

Assistant:

RK_S64 mpp_stopwatch_elapsed_time(MppStopwatch stopwatch)
{
    if (NULL == stopwatch || check_is_mpp_stopwatch(stopwatch)) {
        mpp_err_f("invalid stopwatch %p\n", stopwatch);
        return 0;
    }

    MppStopwatchImpl *impl = (MppStopwatchImpl *)stopwatch;
    if (impl->filled_count < 2)
        return 0;

    RK_S64 base_time = impl->nodes[0].time;
    RK_S64 curr_time = impl->nodes[impl->filled_count - 1].time;
    RK_S64 elapsed_time = curr_time - base_time;
    return elapsed_time;
}